

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

int __thiscall procxx::pipe_streambuf::close(pipe_streambuf *this,int __fd)

{
  pipe_end pVar1;
  int iVar2;
  
  pipe_ostreambuf::close(&this->super_pipe_ostreambuf,__fd);
  pVar1 = pipe_t::read_end();
  if (pVar1.end_ == __fd) {
    return pVar1.end_;
  }
  (**(code **)(*(long *)&this->super_pipe_ostreambuf + 0x78))(this);
  pVar1 = pipe_t::write_end();
  iVar2 = pipe_t::close(&this->stdin_pipe_,pVar1.end_);
  return iVar2;
}

Assistant:

void close(pipe_t::pipe_end end) override {
    pipe_ostreambuf::close(end);
    if (end != pipe_t::read_end()) {
      flush();
      stdin_pipe().close(pipe_t::write_end());
    }
  }